

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O3

string * __thiscall
flatbuffers::Namer::Format(string *__return_storage_ptr__,Namer *this,string *s,Case casing)

{
  string local_40;
  
  if ((this->config_).escape_keywords == BeforeConvertingCase) {
    (*this->_vptr_Namer[0xe])(&local_40,this);
    ConvertCase(__return_storage_ptr__,&local_40,casing,kLowerCamel);
  }
  else {
    ConvertCase(&local_40,s,casing,kLowerCamel);
    (*this->_vptr_Namer[0xe])(__return_storage_ptr__,this,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Format(const std::string &s, Case casing) const {
    if (config_.escape_keywords == Config::Escape::BeforeConvertingCase) {
      return ConvertCase(EscapeKeyword(s), casing, Case::kLowerCamel);
    } else {
      return EscapeKeyword(ConvertCase(s, casing, Case::kLowerCamel));
    }
  }